

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.cpp
# Opt level: O0

void __thiscall
llvm::ManagedStaticBase::RegisterManagedStatic
          (ManagedStaticBase *this,_func_void_ptr *Creator,_func_void_void_ptr *Deleter)

{
  bool bVar1;
  Mutex *m;
  __pointer_type pvVar2;
  void *pvVar3;
  void *Tmp;
  MutexGuard Lock;
  _func_void_void_ptr *Deleter_local;
  _func_void_ptr *Creator_local;
  ManagedStaticBase *this_local;
  
  Lock.M = (Mutex *)Deleter;
  if (Creator == (_func_void_ptr *)0x0) {
    __assert_fail("Creator",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                  ,0x25,
                  "void llvm::ManagedStaticBase::RegisterManagedStatic(void *(*)(), void (*)(void *)) const"
                 );
  }
  bVar1 = llvm_is_multithreaded();
  if (bVar1) {
    m = getManagedStaticMutex();
    MutexGuard::MutexGuard((MutexGuard *)&Tmp,m);
    pvVar2 = std::atomic<void_*>::load(&this->Ptr,memory_order_relaxed);
    if (pvVar2 == (__pointer_type)0x0) {
      pvVar3 = (*Creator)();
      std::atomic<void_*>::store(&this->Ptr,pvVar3,memory_order_release);
      this->DeleterFn = (_func_void_void_ptr *)Lock.M;
      this->Next = StaticList;
      StaticList = this;
    }
    MutexGuard::~MutexGuard((MutexGuard *)&Tmp);
  }
  else {
    pvVar2 = std::atomic::operator_cast_to_void_((atomic *)this);
    bVar1 = false;
    if (pvVar2 == (__pointer_type)0x0) {
      bVar1 = false;
      if (this->DeleterFn == (_func_void_void_ptr *)0x0) {
        bVar1 = false;
        if (this->Next == (ManagedStaticBase *)0x0) {
          bVar1 = true;
        }
      }
    }
    if (!bVar1) {
      __assert_fail("!Ptr && !DeleterFn && !Next && \"Partially initialized ManagedStatic!?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                    ,0x35,
                    "void llvm::ManagedStaticBase::RegisterManagedStatic(void *(*)(), void (*)(void *)) const"
                   );
    }
    pvVar3 = (*Creator)();
    std::atomic<void_*>::operator=(&this->Ptr,pvVar3);
    this->DeleterFn = (_func_void_void_ptr *)Lock.M;
    this->Next = StaticList;
    StaticList = this;
  }
  return;
}

Assistant:

void ManagedStaticBase::RegisterManagedStatic(void *(*Creator)(),
                                              void (*Deleter)(void*)) const {
  assert(Creator);
  if (llvm_is_multithreaded()) {
    MutexGuard Lock(*getManagedStaticMutex());

    if (!Ptr.load(std::memory_order_relaxed)) {
      void *Tmp = Creator();

      Ptr.store(Tmp, std::memory_order_release);
      DeleterFn = Deleter;

      // Add to list of managed statics.
      Next = StaticList;
      StaticList = this;
    }
  } else {
    assert(!Ptr && !DeleterFn && !Next &&
           "Partially initialized ManagedStatic!?");
    Ptr = Creator();
    DeleterFn = Deleter;

    // Add to list of managed statics.
    Next = StaticList;
    StaticList = this;
  }
}